

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O2

QList<int> * __thiscall
QDBusMenuAdaptor::AboutToShowGroup
          (QList<int> *__return_storage_ptr__,QDBusMenuAdaptor *this,QList<int> *ids,
          QList<int> *idErrors)

{
  int **debug;
  int *piVar1;
  long lVar2;
  QLoggingCategory *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QList<int> local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QtPrivateLogging::qLcMenu();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    debug = &local_48.d.ptr;
    ::operator<<((QDebug)debug,&local_48);
    QDebug::~QDebug((QDebug *)debug);
    QDebug::~QDebug((QDebug *)&local_48);
  }
  QList<int>::clear(idErrors);
  piVar1 = (ids->d).ptr;
  lVar2 = (ids->d).size;
  for (lVar4 = 0; lVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    AboutToShow(this,*(int *)((long)piVar1 + lVar4));
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDBusMenuAdaptor::AboutToShowGroup(const QList<int> &ids, QList<int> &idErrors)
{
    qCDebug(qLcMenu) << ids;
    Q_UNUSED(idErrors);
    idErrors.clear();
    for (int id : ids)
        AboutToShow(id);
    return QList<int>(); // updatesNeeded
}